

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::whois_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int iVar2;
  char *pcVar3;
  clientinfo *ci;
  char *pcVar4;
  allocator local_ed1;
  stringformatter local_ed0;
  string s;
  Response res;
  string msg;
  Request req;
  string r_str;
  string amsg;
  int local_894;
  char lmsg [3] [255];
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    if (1000 < cn) {
      iVar2 = QServ::getSender(&qs);
      pcVar3 = QServ::getCommandDesc(&qs,cid);
      goto LAB_0014f551;
    }
  }
  else {
    cn = QServ::getSender(&qs);
  }
  ci = QServ::getClient(&qs,cn);
  if (ci == (clientinfo *)0x0) {
    iVar2 = QServ::getSender(&qs);
    pcVar3 = "\f3Error: Player not connected";
LAB_0014f551:
    sendf(iVar2,1,"ris",0x23,pcVar3);
    return;
  }
  if (ci->connected != true) {
    return;
  }
  pcVar3 = QServ::cntoip(&qs,cn);
  iVar2 = strcmp("127.0.0.1",pcVar3);
  if (iVar2 == 0) {
    amsg._0_8_ = "localhost";
  }
  else {
    QServ::cgip_abi_cxx11_((string *)amsg,&qs,pcVar3);
    std::__cxx11::string::~string((string *)amsg);
    if (amsg._0_8_ == 0) {
      builtin_strncpy(lmsg[1],"Unknown Location",0x11);
      goto LAB_0014f57e;
    }
  }
  strcpy(lmsg[1],(char *)amsg._0_8_);
LAB_0014f57e:
  QServ::getlastCI((clientinfo *)amsg,&qs);
  if (local_894 == 3) {
    sprintf(lmsg[0],"%s (%s)",lmsg + 1,pcVar3);
  }
  else {
    strcpy(lmsg[0],lmsg[1]);
  }
  clientinfo::~clientinfo((clientinfo *)amsg);
  if (qs.enable_HTTP_geo == true) {
    amsg._0_8_ = r_str;
    stringformatter::operator()
              ((stringformatter *)amsg,"%s%s%s","http://ip-api.com/line/",pcVar3,
               "?fields=city,regionName,country");
    std::__cxx11::string::string((string *)amsg,r_str,(allocator *)msg);
    http::Request::Request(&req,(string *)amsg,V4);
    std::__cxx11::string::~string((string *)amsg);
    std::__cxx11::string::string((string *)amsg,"GET",(allocator *)&local_ed0);
    std::__cxx11::string::string((string *)msg,"",&local_ed1);
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length = 0;
    s.field_2._M_allocated_capacity = 0;
    http::Request::send((Request *)&res,(int)&req,amsg,(size_t)msg,(int)&s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s);
    std::__cxx11::string::~string((string *)msg);
    std::__cxx11::string::~string((string *)amsg);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)&s,
               res.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               res.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)amsg,"\n",(allocator *)&local_ed0);
    std::__cxx11::string::string((string *)msg," > ",&local_ed1);
    ::RString(&s,(string *)amsg,(string *)msg);
    std::__cxx11::string::~string((string *)msg);
    std::__cxx11::string::~string((string *)amsg);
    ::UTFEncode(&s);
    std::__cxx11::string::erase((ulong)&s,s._M_string_length - 2);
    amsg._0_8_ = (string *)msg;
    pcVar4 = colorname(ci);
    stringformatter::operator()
              ((stringformatter *)amsg,"Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s",pcVar4,
               (ulong)(uint)ci->clientnum,s._M_dataplus._M_p);
    iVar2 = QServ::getSender(&qs);
    sendf(iVar2,1,"ris",0x23,msg);
    QServ::getlastCI((clientinfo *)amsg,&qs);
    clientinfo::~clientinfo((clientinfo *)amsg);
    if (local_894 == 3) {
      local_ed0.buf = amsg;
      stringformatter::operator()(&local_ed0,"IP: \f2%s",pcVar3);
      iVar2 = QServ::getSender(&qs);
      sendf(iVar2,1,"ris",0x23,amsg);
    }
    std::__cxx11::string::~string((string *)&s);
    http::Response::~Response(&res);
    http::Request::~Request(&req);
  }
  else {
    r_str._0_8_ = (clientinfo *)amsg;
    pcVar3 = colorname(ci);
    stringformatter::operator()
              ((stringformatter *)r_str,"Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",pcVar3,
               (ulong)(uint)ci->clientnum,lmsg);
    iVar2 = QServ::getSender(&qs);
    sendf(iVar2,1,"ris",0x23,(clientinfo *)amsg);
  }
  return;
}

Assistant:

QSERV_CALLBACK whois_cmd(p) {
        #include <stdio.h>

        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    sendinfo:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            char *ip = toip(cn), lmsg[3][255];
                            const char *location;

                            if(!strcmp("127.0.0.1", ip)) {
                                location = (char*)"localhost";
                            } else {
                                location = qs.cgip(ip).c_str(); //qs.congeoip(ip); <-- just country

                                if(!location) {
                                    sprintf(lmsg[1], "%s", "Unknown Location");
                                }
                            }
                            if(location) sprintf(lmsg[1], "%s", location);
                            (CMD_SCI.privilege == PRIV_ADMIN) ? sprintf(lmsg[0], "%s (%s)", lmsg[1], ip) : sprintf(lmsg[0], "%s", lmsg[1]);
                            if(qs.enable_HTTP_geo) {
                                try
                                {
                                    defformatstring(r_str)("%s%s%s", "http://ip-api.com/line/", ip, "?fields=city,regionName,country");
                                    http::Request req(r_str);
                                    const http::Response res = req.send("GET");
                                    std::string s(res.body.begin(), res.body.end());
                                    RString(s, "\n", " > ");
                                    UTFEncode(s);
                                    s.erase(s.length()-2, 2);
                                    defformatstring(msg)("Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s", colorname(ci), ci->clientnum, s.c_str());
                                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
                                    if(CMD_SCI.privilege == PRIV_ADMIN){
                                        defformatstring(amsg)("IP: \f2%s", ip);
                                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, amsg);
                                    }
                                }
                                catch (const std::exception& e)
                                {
                                    std::cerr << "HTTP geolocation localhost connect or failed with: " << e.what() << '\n';
                                }
                            }
                            else {
                                 defformatstring(s)("Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",colorname(ci), ci->clientnum,lmsg[0]);
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, s);
                            }
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto sendinfo;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }